

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O3

void __thiscall DFsVariable::GetValue(DFsVariable *this,svalue_t *returnvar)

{
  int iVar1;
  AActor *pAVar2;
  
  switch(this->type) {
  case 0:
    returnvar->type = 0;
    FString::operator=(&returnvar->string,&this->string);
    return;
  default:
    returnvar->type = this->type;
    iVar1 = (this->value).i;
    break;
  case 2:
    returnvar->type = 2;
    pAVar2 = (this->actor).field_0.p;
    if (pAVar2 != (AActor *)0x0) {
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_006b39e5;
      (this->actor).field_0.p = (AActor *)0x0;
    }
    pAVar2 = (AActor *)0x0;
LAB_006b39e5:
    (returnvar->value).mobj = pAVar2;
    return;
  case 7:
    returnvar->type = 1;
    iVar1 = *(this->value).pI;
    break;
  case 8:
    returnvar->type = 2;
    returnvar->value = *(anon_union_8_3_837bfa25_for_value *)(this->value).pMobj;
    return;
  case 9:
    returnvar->type = 1;
    iVar1 = ((this->value).ls)->number;
  }
  (returnvar->value).i = iVar1;
  return;
}

Assistant:

void DFsVariable::GetValue(svalue_t &returnvar)
{
	switch (type)
	{
	case svt_pInt:
		returnvar.type = svt_int;
		returnvar.value.i = *value.pI;
		break;

	case svt_pMobj:
		returnvar.type = svt_mobj;
		returnvar.value.mobj = *value.pMobj;
		break;

	case svt_mobj:
		returnvar.type = type;
		returnvar.value.mobj = actor;
		break;

	case svt_linespec:
		returnvar.type = svt_int;
		returnvar.value.i = value.ls->number;
		break;

	case svt_string:
		returnvar.type = type;
		returnvar.string = string;
		break;

	default:
		// copy the value (also handles fixed)
		returnvar.type = type;
		returnvar.value.i = value.i;
		break;
    }
}